

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockRangeFactory.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::BlockRangeFactory::buildRanges(BlockRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  TokenFactory *this_00;
  bool bVar1;
  bool bVar2;
  RangeToken *pRVar3;
  int i;
  long lVar4;
  undefined1 *str1;
  bool bVar5;
  
  if ((this->super_RangeFactory).fRangesCreated == false) {
    if ((this->super_RangeFactory).fKeywordsInitialized == false) {
      (*(this->super_RangeFactory)._vptr_RangeFactory[2])(this);
    }
    this_00 = rangeTokMap->fTokenFactory;
    str1 = fgBlockNames;
    bVar1 = false;
    bVar5 = false;
    for (lVar4 = 0; lVar4 != 0x5d; lVar4 = lVar4 + 1) {
      pRVar3 = TokenFactory::createRange(this_00,false);
      (*(pRVar3->super_Token)._vptr_Token[0xc])
                (pRVar3,(ulong)(uint)(&blockRanges)[lVar4 * 2],
                 (ulong)(uint)(&DAT_0033de94)[lVar4 * 2]);
      bVar2 = !bVar1;
      bVar1 = true;
      if (bVar2) {
        bVar1 = XMLString::equals((XMLCh *)str1,(XMLCh *)fgBlockIsSpecials);
        if (bVar1) {
          (*(pRVar3->super_Token)._vptr_Token[0xc])(pRVar3,0xfff0,0xfffd);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      bVar2 = !bVar5;
      bVar5 = true;
      if (bVar2) {
        bVar2 = XMLString::equals((XMLCh *)str1,(XMLCh *)fgBlockIsPrivateUse);
        if (bVar2) {
          (*(pRVar3->super_Token)._vptr_Token[0xc])(pRVar3,0xf0000,0xffffd);
          (*(pRVar3->super_Token)._vptr_Token[0xc])(pRVar3,0x100000,0x10fffd);
        }
        else {
          bVar5 = false;
        }
      }
      RangeToken::createMap(pRVar3);
      RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)str1,pRVar3,false);
      pRVar3 = RangeToken::complementRanges(pRVar3,this_00,XMLPlatformUtils::fgMemoryManager);
      RangeToken::createMap(pRVar3);
      RangeTokenMap::setRangeToken(rangeTokMap,(XMLCh *)str1,pRVar3,true);
      str1 = (undefined1 *)((long)str1 + 100);
    }
    (this->super_RangeFactory).fRangesCreated = true;
  }
  return;
}

Assistant:

void BlockRangeFactory::buildRanges(RangeTokenMap *rangeTokMap) {

    if (fRangesCreated)
        return;

    if (!fKeywordsInitialized) {
        initializeKeywordMap(rangeTokMap);
    }

    TokenFactory* tokFactory = rangeTokMap->getTokenFactory();

    //for performance, once the desired specials and private use are found
    //don't need to compareString anymore
    bool foundSpecial = false;
    bool foundPrivate = false;

    for (int i=0; i < BLOCKNAMESIZE; i++) {
        RangeToken* tok = tokFactory->createRange();
        tok->addRange(blockRanges[i*2], blockRanges[(i*2)+1]);

        if (!foundSpecial && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsSpecials)) {
            tok->addRange(0xFFF0, 0xFFFD);
            foundSpecial = true;
        }
        if (!foundPrivate && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsPrivateUse)) {
            tok->addRange(0xF0000, 0xFFFFD);
            tok->addRange(0x100000, 0x10FFFD);
            foundPrivate = true;
        }

        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok);
        tok = RangeToken::complementRanges(tok, tokFactory);
        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok , true);
    }

    fRangesCreated = true;
}